

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int ecdh_get_params_internal
              (mbedtls_ecdh_context_mbed *ctx,mbedtls_ecp_keypair *key,mbedtls_ecdh_side side)

{
  int local_28;
  int ret;
  mbedtls_ecdh_side side_local;
  mbedtls_ecp_keypair *key_local;
  mbedtls_ecdh_context_mbed *ctx_local;
  
  if (side == MBEDTLS_ECDH_THEIRS) {
    ctx_local._4_4_ = mbedtls_ecp_copy(&ctx->Qp,&key->Q);
  }
  else if (side == MBEDTLS_ECDH_OURS) {
    local_28 = mbedtls_ecp_copy(&ctx->Q,&key->Q);
    if ((local_28 == 0) && (local_28 = mbedtls_mpi_copy(&ctx->d,&key->d), local_28 == 0)) {
      return 0;
    }
    ctx_local._4_4_ = local_28;
  }
  else {
    ctx_local._4_4_ = -0x4f80;
  }
  return ctx_local._4_4_;
}

Assistant:

static int ecdh_get_params_internal(mbedtls_ecdh_context_mbed *ctx,
                                    const mbedtls_ecp_keypair *key,
                                    mbedtls_ecdh_side side)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /* If it's not our key, just import the public part as Qp */
    if (side == MBEDTLS_ECDH_THEIRS) {
        return mbedtls_ecp_copy(&ctx->Qp, &key->Q);
    }

    /* Our key: import public (as Q) and private parts */
    if (side != MBEDTLS_ECDH_OURS) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    if ((ret = mbedtls_ecp_copy(&ctx->Q, &key->Q)) != 0 ||
        (ret = mbedtls_mpi_copy(&ctx->d, &key->d)) != 0) {
        return ret;
    }

    return 0;
}